

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Node * prvTidyNewNode(TidyAllocator *allocator,Lexer *lexer)

{
  Node *__s;
  Node *node;
  Lexer *lexer_local;
  TidyAllocator *allocator_local;
  
  __s = (Node *)(*allocator->vtbl->alloc)(allocator,0x70);
  memset(__s,0,0x70);
  if (lexer != (Lexer *)0x0) {
    __s->line = lexer->lines;
    __s->column = lexer->columns;
  }
  __s->type = TextNode;
  return __s;
}

Assistant:

Node *TY_(NewNode)(TidyAllocator* allocator, Lexer *lexer)
{
    Node* node = (Node*) TidyAlloc( allocator, sizeof(Node) );
    TidyClearMemory( node, sizeof(Node) );
    if ( lexer )
    {
        node->line = lexer->lines;
        node->column = lexer->columns;
    }
    node->type = TextNode;
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_ALLOCATION)
    SPRTF("Allocated node %p\n", node );
#endif
    return node;
}